

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_RealVect.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *ostr,RealVect *p)

{
  ostream *poVar1;
  Real *pRVar2;
  RealVect *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"(");
  pRVar2 = RealVect::operator[](in_RSI,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pRVar2);
  poVar1 = std::operator<<(poVar1,",");
  pRVar2 = RealVect::operator[](in_RSI,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pRVar2);
  poVar1 = std::operator<<(poVar1,",");
  pRVar2 = RealVect::operator[](in_RSI,2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pRVar2);
  std::operator<<(poVar1,")");
  return in_RDI;
}

Assistant:

std::ostream&
  operator<< (std::ostream& ostr, const RealVect& p)
  {
    ostr << "(" << AMREX_D_TERM ( p[0] ,<< "," << p[1], << "," << p[2]) << ")" ;
    return ostr;
  }